

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void WriteVarInt<VectorWriter,(VarIntMode)0,unsigned_long>(VectorWriter *os,unsigned_long n)

{
  size_t in_RCX;
  ulong uVar1;
  long in_FS_OFFSET;
  bool bVar2;
  uchar tmp [10];
  byte local_2b;
  byte local_2a [10];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_2a[0] = (byte)n & 0x7f;
  if (n < 0x80) {
    uVar1 = 0;
  }
  else {
    uVar1 = 0;
    do {
      n = (n >> 7) - 1;
      in_RCX = n & 0xffffffff | 0x80;
      local_2a[uVar1 + 1] = (byte)in_RCX;
      uVar1 = uVar1 + 1;
    } while (0x7f < n);
    uVar1 = uVar1 & 0xffffffff;
  }
  do {
    local_2b = local_2a[uVar1];
    VectorWriter::write(os,(int)&local_2b,(void *)0x1,in_RCX);
    bVar2 = uVar1 != 0;
    uVar1 = uVar1 - 1;
  } while (bVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteVarInt(Stream& os, I n)
{
    CheckVarIntMode<Mode, I>();
    unsigned char tmp[(sizeof(n)*8+6)/7];
    int len=0;
    while(true) {
        tmp[len] = (n & 0x7F) | (len ? 0x80 : 0x00);
        if (n <= 0x7F)
            break;
        n = (n >> 7) - 1;
        len++;
    }
    do {
        ser_writedata8(os, tmp[len]);
    } while(len--);
}